

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

GLenum __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreIncompleteTexturesTest::Create2DRGBA8CompleteTexture
          (ImageLoadStoreIncompleteTexturesTest *this,GLubyte magic_number,GLuint *out_texture_id)

{
  CallLogWrapper *this_00;
  uint uVar1;
  GLenum GVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  GLuint texture_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  
  texture_id = 0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&texture_data,(ulong)(this->m_texture_edge * this->m_texture_edge * 4));
  uVar1 = this->m_texture_edge;
  if (uVar1 != 0) {
    iVar3 = 0;
    uVar4 = 0;
    do {
      if (this->m_texture_edge != 0) {
        uVar1 = uVar1 * iVar3;
        uVar5 = 0;
        do {
          texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1] = (uchar)uVar5;
          texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(ulong)uVar1 + 1] = (uchar)uVar4;
          texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(ulong)uVar1 + 2] = magic_number;
          texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(ulong)uVar1 + 3] = 0xcc;
          uVar5 = uVar5 + 1;
          uVar1 = uVar1 + 4;
        } while (uVar5 < this->m_texture_edge);
      }
      uVar4 = uVar4 + 1;
      uVar1 = this->m_texture_edge;
      iVar3 = iVar3 + 4;
    } while (uVar4 < uVar1);
  }
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture_id);
  GVar2 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar2 == 0) {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture_id);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 == 0) {
      glu::CallLogWrapper::glTexImage2D
                (this_00,0xde1,0,0x8058,this->m_texture_edge,this->m_texture_edge,0,0x1908,0x1401,
                 texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      GVar2 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar2 == 0) {
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x813c,0);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x813d,0);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
        GVar2 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar2 == 0) {
          *out_texture_id = texture_id;
          GVar2 = 0;
        }
        else {
          glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
        }
      }
      else {
        glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
      }
    }
    else {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
    }
  }
  if (texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)texture_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texture_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return GVar2;
}

Assistant:

GLenum Create2DRGBA8CompleteTexture(GLubyte magic_number, GLuint& out_texture_id)
	{
		/* Constants to calculate size of texture */
		static const GLuint n_components	  = 4; /* RGBA */
		const GLuint		texture_data_size = m_texture_edge * m_texture_edge * n_components;

		/* Error code */
		GLenum err = 0;

		/* Texture id */
		GLuint texture_id = 0;

		/* Prepare storage for texture data */
		std::vector<GLubyte> texture_data;
		texture_data.resize(texture_data_size);

		/* Prepare texture data */
		for (GLuint y = 0; y < m_texture_edge; ++y)
		{
			const GLuint line_offset = y * m_texture_edge * n_components;

			for (GLuint x = 0; x < m_texture_edge; ++x)
			{
				const GLuint texel_offset = x * n_components + line_offset;

				SetTexel(&texture_data[texel_offset], static_cast<GLubyte>(x), static_cast<GLubyte>(y), magic_number);
			}
		}

		/* Generate texture */
		glGenTextures(1, &texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			return err;
		}

		/* Bind texture */
		glBindTexture(GL_TEXTURE_2D, texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Allocate storage and fill texture */
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA8, m_texture_edge, m_texture_edge, 0 /* border */, GL_RGBA,
					 GL_UNSIGNED_BYTE, &texture_data[0]);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Make texture complete */
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Set out_texture_id */
		out_texture_id = texture_id;

		/* Done */
		return GL_NO_ERROR;
	}